

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CriticalSectionsBuilder.cpp
# Opt level: O2

void __thiscall CriticalSectionsBuilder::preVisit(CriticalSectionsBuilder *this,Node *node)

{
  type *unlockNode;
  type *local_20;
  Node *local_18;
  
  local_18 = node;
  std::_Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>>::
  _M_insert_unique<Node*const&>
            ((_Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>> *)
             &this->visited_,&local_18);
  local_20 = castNode<(NodeType)4,Node>(local_18);
  if (local_20 != (type *)0x0) {
    std::
    _Rb_tree<UnlockNode_*,_UnlockNode_*,_std::_Identity<UnlockNode_*>,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_>
    ::erase(&(this->currentUnlocks)._M_t,&local_20);
  }
  return;
}

Assistant:

void CriticalSectionsBuilder::preVisit(Node *node) {
    visited_.insert(node);
    if (auto *unlockNode = castNode<NodeType::UNLOCK>(node)) {
        currentUnlocks.erase(unlockNode);
    }
}